

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.cc
# Opt level: O0

void __thiscall
bsplib::Rdma::hpput(Rdma *this,void *src,int dst_pid,Memslot dst_slot,size_t dst_offset,size_t size)

{
  Memblock *pMVar1;
  ssize_t sVar2;
  int __flags;
  undefined1 local_88 [8];
  Action action;
  void *pvStack_48;
  int tag;
  size_type local_40;
  Memslot src_slot;
  size_t size_local;
  size_t dst_offset_local;
  Memslot dst_slot_local;
  void *pvStack_18;
  int dst_pid_local;
  void *src_local;
  Rdma *this_local;
  
  src_slot = size;
  size_local = dst_offset;
  dst_offset_local = dst_slot;
  dst_slot_local._4_4_ = dst_pid;
  pvStack_18 = src;
  src_local = this;
  if (size < this->m_min_n_hp_msg_size) {
    put(this,src,dst_pid,dst_slot,dst_offset,size);
  }
  else {
    pMVar1 = slot(this,this->m_pid,dst_slot);
    __flags = (int)dst_offset;
    if ((pMVar1->status & 1) != 0) {
      __assert_fail("! (slot( m_pid, dst_slot ).status & Memblock::PUSHED)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/rdma.cc"
                    ,0x68,"void bsplib::Rdma::hpput(const void *, int, Memslot, size_t, size_t)");
    }
    local_40 = std::vector<void_*,_std::allocator<void_*>_>::size(&this->m_local_slots);
    pvStack_48 = pvStack_18;
    std::vector<void_*,_std::allocator<void_*>_>::push_back
              (&this->m_local_slots,&stack0xffffffffffffffb8);
    sVar2 = Unbuf::send(&this->m_unbuf,dst_slot_local._4_4_,pvStack_18,src_slot,__flags);
    action.src_pid = (int)sVar2;
    local_88._0_4_ = HPPUT;
    local_88._4_4_ = dst_slot_local._4_4_;
    action.kind = this->m_pid;
    action.target_pid = dst_slot_local._4_4_;
    action._16_8_ = local_40;
    action.src_slot = dst_offset_local;
    action.dst_slot = size_local;
    action.offset = src_slot;
    action.size._4_4_ = action.src_pid;
    ActionBuf::push_back(&this->m_send_actions,(Action *)local_88);
  }
  return;
}

Assistant:

void Rdma::hpput( const void * src,
        int dst_pid, Memslot dst_slot, size_t dst_offset, size_t size )
{
#ifdef PROFILE
    TicToc t( TicToc::HPPUT );
#endif
    if ( size < m_min_n_hp_msg_size ) { 
        put( src, dst_pid, dst_slot, dst_offset, size );
        return;
    }

    assert( ! (slot( m_pid, dst_slot ).status & Memblock::PUSHED) );
    
    Memslot src_slot = m_local_slots.size();
    m_local_slots.push_back( const_cast<void *>(src) );

    int tag = m_unbuf.send( dst_pid, src, size );

    Action action = { Action::HPPUT, dst_pid, m_pid, dst_pid,
                      tag, src_slot, dst_slot , dst_offset, size };
    m_send_actions.push_back( action );
}